

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-kalman-filter.cpp
# Opt level: O0

double testExtendedKalmanFilterZeroInput(void)

{
  Scalar SVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  Scalar *pSVar5;
  Scalar *pSVar6;
  result_type rVar7;
  RealScalar RVar8;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> PVar9
  ;
  Index *local_aa98;
  Index *local_aa80;
  Index *local_a980;
  Index *local_a960;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_a958;
  undefined1 local_a940 [8];
  StateVector error;
  undefined1 local_a920 [8];
  Cmatrix c;
  Amatrix a;
  double dStack_a8e8;
  uint i;
  Matrix<double,__1,_1,_0,__1,_1> local_a8e0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_a8d0;
  undefined1 local_a8a8 [8];
  StateVector dx;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
  local_a890;
  uint local_a87c;
  undefined1 local_a878 [4];
  uint i_3;
  Pmatrix p;
  StateVector xh;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_a840;
  Matrix<double,__1,_1,_0,__1,_1> local_a828;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_a818;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_a800;
  double local_a7f0;
  double local_a7e8;
  undefined1 local_a7e0 [8];
  normal_distribution<double> g_1;
  undefined1 local_a7c8 [4];
  uint i_2;
  MeasureVector w;
  double local_a7a8;
  double local_a7a0;
  undefined1 local_a798 [8];
  normal_distribution<double> g;
  undefined1 local_a780 [4];
  uint i_1;
  StateVector v;
  TransposeReturnType TStack_a768;
  uint k;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
  local_a760;
  undefined1 local_a750 [8];
  Qmatrix q;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
  local_a730;
  undefined1 local_a720 [8];
  Rmatrix r;
  Matrix<double,__1,__1,_0,__1,__1> local_a700;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_a6e8;
  undefined1 local_a6c0 [8];
  Qmatrix q1;
  Matrix<double,__1,__1,_0,__1,__1> local_a6a0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_a688;
  undefined1 local_a660 [8];
  Rmatrix r1;
  lagged_fibonacci1279 gen_;
  StateVector x;
  InputVector u;
  MeasureVector yk [1000];
  StateVector xk [1001];
  Cmatrix local_110;
  double local_f8;
  Matrix<double,__1,__1,_0,__1,__1> local_f0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_d8;
  Amatrix local_b0;
  undefined1 local_98 [8];
  KalmanFunctor func;
  
  if (testExtendedKalmanFilterZeroInput()::f == '\0') {
    iVar3 = __cxa_guard_acquire(&testExtendedKalmanFilterZeroInput()::f);
    if (iVar3 != 0) {
      stateObservation::ExtendedKalmanFilter::ExtendedKalmanFilter
                ((ExtendedKalmanFilter *)testExtendedKalmanFilterZeroInput()::f,4,3,0,true,true);
      __cxa_atexit(stateObservation::ExtendedKalmanFilter::~ExtendedKalmanFilter,
                   testExtendedKalmanFilterZeroInput()::f,&__dso_handle);
      __cxa_guard_release(&testExtendedKalmanFilterZeroInput()::f);
    }
  }
  testExtendedKalmanFilterZeroInput::KalmanFunctor::KalmanFunctor((KalmanFunctor *)local_98);
  stateObservation::KalmanFilterBase::getAmatrixRandom();
  local_f8 = 0.5;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
            (&local_d8,(MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_f0,&local_f8);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_b0,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
              *)&local_d8);
  testExtendedKalmanFilterZeroInput()::KalmanFunctor::setA(Eigen::
  Matrix<double,_1,_1,0,_1,_1>_const__(local_98,&local_b0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_b0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_f0);
  stateObservation::KalmanFilterBase::getCmatrixRandom();
  testExtendedKalmanFilterZeroInput()::KalmanFunctor::setC(Eigen::
  Matrix<double,_1,_1,0,_1,_1>_const__(local_98,&local_110);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_110);
  stateObservation::ExtendedKalmanFilter::setFunctor
            ((DynamicalSystemFunctorBase *)testExtendedKalmanFilterZeroInput()::f);
  local_a960 = &yk[999].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows;
  do {
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_a960);
    local_a960 = local_a960 + 2;
  } while (local_a960 !=
           &xk[1000].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
          );
  local_a980 = &u.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  do {
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_a980);
    local_a980 = local_a980 + 2;
  } while (local_a980 !=
           &yk[999].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
  ;
  stateObservation::ObserverBase::inputVectorZero();
  stateObservation::ObserverBase::stateVectorZero();
  boost::random::lagged_fibonacci_01_engine<double,_48,_1279U,_418U>::lagged_fibonacci_01_engine
            ((lagged_fibonacci_01_engine<double,_48,_1279U,_418U> *)
             &r1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  stateObservation::KalmanFilterBase::getRmatrixRandom();
  q1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       0x3f847ae147ae147b;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
            (&local_a688,(MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_a6a0,
             (double *)
             &q1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_a660,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
              *)&local_a688);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_a6a0);
  stateObservation::KalmanFilterBase::getQmatrixRandom();
  r.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       0x3f847ae147ae147b;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
            (&local_a6e8,(MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_a700,
             (double *)
             &r.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_a6c0,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
              *)&local_a6e8);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_a700);
  q.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       (Index)Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_a660);
  local_a730 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                         ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_a660,
                          (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                           *)&q.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                              m_storage.m_cols);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_a720,&local_a730);
  TStack_a768 = Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                          ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_a6c0);
  local_a760 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                         ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_a6c0,
                          (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                           *)&stack0xffffffffffff5898);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_a750,&local_a760);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
            ((Matrix<double,__1,_1,_0,__1,_1> *)
             &yk[999].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows,(Matrix<double,__1,_1,_0,__1,_1> *)(gen_.x + 0x4fe));
  for (v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ = 1;
      v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ <
      0x3e9; v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_
                  = v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows._4_4_ + 1) {
    stateObservation::ObserverBase::stateVectorZero();
    g._sigma._4_4_ = 0;
    while( true ) {
      uVar2 = g._sigma._4_4_;
      uVar4 = stateObservation::ObserverBase::getStateSize();
      if (uVar4 <= uVar2) break;
      local_a7a0 = 0.0;
      local_a7a8 = 1.0;
      boost::random::normal_distribution<double>::normal_distribution
                ((normal_distribution<double> *)local_a798,&local_a7a0,&local_a7a8);
      rVar7 = boost::random::normal_distribution<double>::operator()
                        ((normal_distribution<double> *)local_a798,
                         (lagged_fibonacci_01_engine<double,_48,_1279U,_418U> *)
                         &r1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                          m_storage.m_cols);
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_a780,
                          (ulong)g._sigma._4_4_);
      *pSVar5 = rVar7;
      g._sigma._4_4_ = g._sigma._4_4_ + 1;
    }
    PVar9 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                      ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_a6c0,
                       (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_a780);
    w.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         (Index)PVar9.m_lhs;
    Eigen::Matrix<double,-1,1,0,-1,1>::operator=
              ((Matrix<double,_1,1,0,_1,1> *)local_a780,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                *)&w.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
              );
    stateObservation::ObserverBase::measureVectorZero();
    g_1._sigma._4_4_ = 0;
    while( true ) {
      uVar2 = g_1._sigma._4_4_;
      uVar4 = stateObservation::ObserverBase::getMeasureSize();
      if (uVar4 <= uVar2) break;
      local_a7e8 = 0.0;
      local_a7f0 = 1.0;
      boost::random::normal_distribution<double>::normal_distribution
                ((normal_distribution<double> *)local_a7e0,&local_a7e8,&local_a7f0);
      rVar7 = boost::random::normal_distribution<double>::operator()
                        ((normal_distribution<double> *)local_a7e0,
                         (lagged_fibonacci_01_engine<double,_48,_1279U,_418U> *)
                         &r1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                          m_storage.m_cols);
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_a7c8,
                          (ulong)g_1._sigma._4_4_);
      *pSVar5 = rVar7;
      g_1._sigma._4_4_ = g_1._sigma._4_4_ + 1;
    }
    PVar9 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                      ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_a660,
                       (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_a7c8);
    local_a800 = PVar9;
    Eigen::Matrix<double,-1,1,0,-1,1>::operator=
              ((Matrix<double,_1,1,0,_1,1> *)local_a7c8,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                *)&local_a800);
    testExtendedKalmanFilterZeroInput()::KalmanFunctor::stateDynamics(Eigen::
    Matrix<double,-1,1,0,-1,1>const&,Eigen::Matrix<double,_1,1,0,_1,1>_const__unsigned_int_
              (&local_a828,(StateVector *)local_98,(InputVector *)(gen_.x + 0x4fe),(int)&x + 8);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
              (&local_a818,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_a828,
               (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_a780);
    Eigen::Matrix<double,-1,1,0,-1,1>::operator=
              ((Matrix<double,_1,1,0,_1,1> *)(gen_.x + 0x4fe),
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&local_a818);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_a828);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
              ((Matrix<double,__1,_1,_0,__1,_1> *)
               &yk[(ulong)v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                          .m_rows._4_4_ + 999].
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
               (Matrix<double,__1,_1,_0,__1,_1> *)(gen_.x + 0x4fe));
    testExtendedKalmanFilterZeroInput()::KalmanFunctor::measureDynamics(Eigen::
    Matrix<double,-1,1,0,-1,1>const&,Eigen::Matrix<double,_1,1,0,_1,1>_const__unsigned_int_
              (&xh.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
               (StateVector *)local_98,(InputVector *)(gen_.x + 0x4fe),(int)&x + 8);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
              (&local_a840,
               (MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)
               &xh.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
               (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_a7c8);
    Eigen::Matrix<double,-1,1,0,-1,1>::operator=
              ((Matrix<double,_1,1,0,_1,1> *)
               &yk[(ulong)(v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                           m_storage.m_rows._4_4_ - 1) - 1].
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&local_a840);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
              ((Matrix<double,__1,_1,_0,__1,_1> *)
               &xh.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_a7c8);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_a780);
  }
  stateObservation::ObserverBase::stateVectorRandom();
  stateObservation::ZeroDelayObserver::setState
            ((Matrix *)testExtendedKalmanFilterZeroInput()::f,(int)yk + 0x3e78);
  stateObservation::KalmanFilterBase::getPmatrixZero();
  stateObservation::KalmanFilterBase::setStateCovariance
            ((Matrix *)testExtendedKalmanFilterZeroInput()::f);
  stateObservation::KalmanFilterBase::setR((Matrix *)testExtendedKalmanFilterZeroInput()::f);
  stateObservation::KalmanFilterBase::setQ((Matrix *)testExtendedKalmanFilterZeroInput()::f);
  local_a87c = 0;
  while( true ) {
    uVar2 = local_a87c;
    uVar4 = stateObservation::ObserverBase::getStateSize();
    if (uVar4 <= uVar2) break;
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        &p.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                         m_storage.m_cols,(ulong)local_a87c);
    SVar1 = *pSVar5;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_a878,
                        (ulong)local_a87c,(ulong)local_a87c);
    *pSVar6 = SVar1;
    local_a87c = local_a87c + 1;
  }
  dx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       (Index)Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_a878);
  local_a890 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                         ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_a878,
                          (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                           *)&dx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_rows);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            ((Matrix<double,_1,_1,0,_1,_1> *)local_a878,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>
              *)&local_a890);
  stateObservation::ObserverBase::stateVectorConstant(1.0);
  dStack_a8e8 = 1e-08;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator*
            (&local_a8d0,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_a8e0,
             &stack0xffffffffffff5718);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
            ((Matrix<double,_1,1,0,_1,1> *)local_a8a8,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)&local_a8d0);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_a8e0);
  for (a.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols._4_4_ = 1
      ; a.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols._4_4_ <
        0x3e9; a.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols.
               _4_4_ = a.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                       m_cols._4_4_ + 1) {
    stateObservation::ZeroDelayObserver::setMeasurement
              ((Matrix *)testExtendedKalmanFilterZeroInput()::f,
               (int)&u + 8 +
               (a.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols.
                _4_4_ - 1) * 0x10);
    stateObservation::ExtendedKalmanFilter::getAMatrixFD
              ((Matrix *)
               &c.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols)
    ;
    stateObservation::ExtendedKalmanFilter::getCMatrixFD((Matrix *)local_a920);
    stateObservation::KalmanFilterBase::setA((Matrix *)testExtendedKalmanFilterZeroInput()::f);
    stateObservation::KalmanFilterBase::setC((Matrix *)testExtendedKalmanFilterZeroInput()::f);
    stateObservation::ZeroDelayObserver::getEstimatedState((int)&error + 8);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
              ((Matrix<double,__1,_1,_0,__1,_1> *)
               &p.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols,
               (Matrix<double,__1,_1,_0,__1,_1> *)
               &error.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
              ((Matrix<double,__1,_1,_0,__1,_1> *)
               &error.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
              ((Matrix<double,__1,__1,_0,__1,__1> *)local_a920);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
              ((Matrix<double,__1,__1,_0,__1,__1> *)
               &c.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols)
    ;
  }
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
            (&local_a958,
             (MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)
             &p.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols,
             (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
             &xk[999].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
            ((Matrix<double,_1,1,0,_1,1> *)local_a940,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_a958);
  RVar8 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::norm
                    ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_a940);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_a940);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_a8a8);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_a878)
  ;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)
             &p.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_a750)
  ;
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_a720)
  ;
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_a6c0)
  ;
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_a660)
  ;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)(gen_.x + 0x4fe));
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)
             &x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  local_aa80 = &yk[999].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows;
  do {
    local_aa80 = local_aa80 + -2;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_aa80);
  } while (local_aa80 !=
           &u.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  local_aa98 = &xk[1000].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows;
  do {
    local_aa98 = local_aa98 + -2;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_aa98);
  } while (local_aa98 !=
           &yk[999].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
  ;
  testExtendedKalmanFilterZeroInput::KalmanFunctor::~KalmanFunctor((KalmanFunctor *)local_98);
  return RVar8;
}

Assistant:

double testExtendedKalmanFilterZeroInput()
{
    const static unsigned kmax=1000;


    typedef stateObservation::ExtendedKalmanFilter ekf;

    static ekf f(4,3);


    class KalmanFunctor:
                public stateObservation::DynamicalSystemFunctorBase
    {

    public:
        KalmanFunctor()
        {
            m_=f.measureVectorRandom()*0.1;
            s_=f.stateVectorRandom()*0.1;
            t_=f.stateVectorRandom();
            n_=f.measureVectorRandom();
        }

        virtual ekf::StateVector stateDynamics(const ekf::StateVector& x, const ekf::InputVector& u, unsigned k)
        {
            (void)k;//unused
            (void)u;//unused

            ekf::StateVector xk1;
            xk1=a_*x+cos(10*(x.transpose()*x)[0])*s_+t_;
            return xk1;
        }

        virtual ekf::MeasureVector measureDynamics(const ekf::StateVector& x, const ekf::InputVector &u,unsigned k)
        {
            (void)k;//unused
            (void)u;//unused

            ekf::MeasureVector yk;
            yk=c_*x+cos(10*(x.transpose()*x)[0])*m_+n_;
            return yk;
        }

        void setA(const ekf::Amatrix& a)
        {
            a_=a;
        }

        void setC(const ekf::Cmatrix& c)
        {
            c_=c;
        }

        virtual unsigned getStateSize() const
        {
            return f.getStateSize();
        }

        virtual unsigned getInputSize() const
        {
            return f.getInputSize();
        }

        virtual unsigned getMeasurementSize() const
        {
            return f.getMeasureSize();
        }

    private:

        ekf::StateVector s_;
        ekf::StateVector t_;
        ekf::MeasureVector m_;
        ekf::MeasureVector n_;

        ekf::Amatrix a_;
        ekf::Cmatrix c_;

    };



    KalmanFunctor func;

    func.setA(f.getAmatrixRandom()*0.5);
    func.setC(f.getCmatrixRandom());



    f.setFunctor(&func);


    ekf::StateVector xk[kmax+1];
    ekf::MeasureVector yk[kmax];
    ekf::InputVector u= f.inputVectorZero();

    ekf::StateVector x=f.stateVectorZero();

    boost::lagged_fibonacci1279 gen_;

    ekf::Rmatrix r1=f.getRmatrixRandom()*0.01;

    ekf::Qmatrix q1=f.getQmatrixRandom()*0.01;

    ekf::Rmatrix r(r1*r1.transpose());
    ekf::Qmatrix q(q1*q1.transpose());

    xk[0]=x;


    for (unsigned k=1; k<=kmax; ++k)
    {
        ekf::StateVector v(f.stateVectorZero());
        for (unsigned i=0;i<f.getStateSize();++i)
        {
            boost::normal_distribution<> g(0, 1);
            v[i]=g(gen_);
        }
        v=q1*v;

        ekf::MeasureVector w(f.measureVectorZero());
        for (unsigned i=0;i<f.getMeasureSize();++i)
        {
            boost::normal_distribution<> g(0, 1);
            w[i]=g(gen_);
        }
        w=r1*w;

        x=func.stateDynamics(x,u,k-1)+v;

        xk[k]=x;
        yk[k-1]=func.measureDynamics(x,u,k)+w;

    }

    ekf::StateVector xh=f.stateVectorRandom();

    f.setState(xk[0],0);

    ekf::Pmatrix p=f.getPmatrixZero();

    f.setStateCovariance(p);

    f.setR(r);
    f.setQ(q);

    for (unsigned i=0;i<f.getStateSize();++i)
    {
        p(i,i)=xh[i];
    }
    p=p*p.transpose();

    ekf::StateVector dx=f.stateVectorConstant(1)*1e-8;

    unsigned i;
    for (i=1;i<=kmax;++i)
    {
        f.setMeasurement(yk[i-1],i);


        ekf::Amatrix a=f.getAMatrixFD(dx);
        ekf::Cmatrix c= f.getCMatrixFD(dx);

        f.setA(a);
        f.setC(c);
        xh=f.getEstimatedState(i);

    }

    ekf::StateVector error=xh-xk[kmax];

    return error.norm();

}